

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Segment::WriteFramesLessThan(Segment *this,uint64_t timestamp)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  int64_t iVar4;
  uint64_t uVar5;
  ulong in_RSI;
  long in_RDI;
  uint64_t unaff_retaddr;
  Segment *in_stack_00000008;
  int32_t i_1;
  int32_t new_frames_size;
  Frame *frame_prev;
  Frame *frame_curr;
  int32_t i;
  int32_t shift_left;
  Cluster *cluster;
  Frame *in_stack_ffffffffffffff88;
  Cluster *in_stack_ffffffffffffff90;
  Cluster *this_00;
  Cluster *in_stack_ffffffffffffffa0;
  int local_40;
  int local_28;
  int local_24;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if ((0 < *(int *)(in_RDI + 0x13c)) && (0 < *(int *)(in_RDI + 0x114))) {
    if (*(long *)(in_RDI + 0x130) == 0) {
      return false;
    }
    if (*(long *)(*(long *)(in_RDI + 0x108) + (long)(*(int *)(in_RDI + 0x114) + -1) * 8) == 0) {
      return false;
    }
    local_24 = 0;
    local_28 = 1;
    while ((local_28 < *(int *)(in_RDI + 0x13c) &&
           (uVar3 = Frame::timestamp(*(Frame **)(*(long *)(in_RDI + 0x130) + (long)local_28 * 8)),
           uVar3 <= in_RSI))) {
      this_00 = *(Cluster **)(*(long *)(in_RDI + 0x130) + (long)(local_28 + -1) * 8);
      iVar4 = Frame::discard_padding((Frame *)this_00);
      if (iVar4 != 0) {
        *(undefined4 *)(in_RDI + 0x968) = 4;
      }
      bVar1 = Cluster::AddFrame(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar1) {
        if (((*(byte *)(in_RDI + 0x94c) & 1) != 0) &&
           (uVar3 = *(uint64_t *)(in_RDI + 0x120), uVar5 = Frame::track_number((Frame *)this_00),
           uVar3 == uVar5)) {
          Frame::timestamp((Frame *)this_00);
          bVar1 = AddCuePoint(in_stack_00000008,unaff_retaddr,
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
          if (!bVar1) {
            in_stack_ffffffffffffffa0 = this_00;
            if (this_00 != (Cluster *)0x0) {
              Frame::~Frame((Frame *)this_00);
              operator_delete(this_00);
              in_stack_ffffffffffffffa0 = this_00;
            }
            goto LAB_00187c09;
          }
        }
        local_24 = local_24 + 1;
        uVar3 = Frame::timestamp((Frame *)this_00);
        if (*(ulong *)(in_RDI + 0x150) < uVar3) {
          uVar3 = Frame::timestamp((Frame *)this_00);
          *(uint64_t *)(in_RDI + 0x150) = uVar3;
          uVar3 = Frame::timestamp((Frame *)this_00);
          uVar5 = Frame::track_number((Frame *)this_00);
          *(uint64_t *)(in_RDI + 0x158 + (uVar5 - 1) * 8) = uVar3;
        }
        in_stack_ffffffffffffff90 = this_00;
        if (this_00 != (Cluster *)0x0) {
          Frame::~Frame((Frame *)in_stack_ffffffffffffffa0);
          operator_delete(this_00);
          in_stack_ffffffffffffff90 = this_00;
        }
      }
      else if (this_00 != (Cluster *)0x0) {
        Frame::~Frame((Frame *)in_stack_ffffffffffffffa0);
        operator_delete(this_00);
      }
LAB_00187c09:
      local_28 = local_28 + 1;
    }
    if (0 < local_24) {
      if (*(int *)(in_RDI + 0x13c) <= local_24) {
        return false;
      }
      iVar2 = *(int *)(in_RDI + 0x13c) - local_24;
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x130) + (long)local_40 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x130) + (long)(local_40 + local_24) * 8);
      }
      *(int *)(in_RDI + 0x13c) = iVar2;
    }
  }
  return true;
}

Assistant:

bool Segment::WriteFramesLessThan(uint64_t timestamp) {
  // Check |cluster_list_size_| to see if this is the first cluster. If it is
  // the first cluster the audio frames that are less than the first video
  // timesatmp will be written in a later step.
  if (frames_size_ > 0 && cluster_list_size_ > 0) {
    if (!frames_)
      return false;

    Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];
    if (!cluster)
      return false;

    int32_t shift_left = 0;

    // TODO(fgalligan): Change this to use the durations of frames instead of
    // the next frame's start time if the duration is accurate.
    for (int32_t i = 1; i < frames_size_; ++i) {
      const Frame* const frame_curr = frames_[i];

      if (frame_curr->timestamp() > timestamp)
        break;

      const Frame* const frame_prev = frames_[i - 1];
      if (frame_prev->discard_padding() != 0)
        doc_type_version_ = 4;
      if (!cluster->AddFrame(frame_prev)) {
        delete frame_prev;
        continue;
      }

      if (new_cuepoint_ && cues_track_ == frame_prev->track_number()) {
        if (!AddCuePoint(frame_prev->timestamp(), cues_track_)) {
          delete frame_prev;
          continue;
        }
      }

      ++shift_left;
      if (frame_prev->timestamp() > last_timestamp_) {
        last_timestamp_ = frame_prev->timestamp();
        last_track_timestamp_[frame_prev->track_number() - 1] =
            frame_prev->timestamp();
      }

      delete frame_prev;
    }

    if (shift_left > 0) {
      if (shift_left >= frames_size_)
        return false;

      const int32_t new_frames_size = frames_size_ - shift_left;
      for (int32_t i = 0; i < new_frames_size; ++i) {
        frames_[i] = frames_[i + shift_left];
      }

      frames_size_ = new_frames_size;
    }
  }

  return true;
}